

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O0

Curl_tree * Curl_splay(curltime i,Curl_tree *t)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  long lVar4;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  long comp;
  Curl_tree *y;
  Curl_tree *r;
  Curl_tree *l;
  Curl_tree N;
  Curl_tree *t_local;
  curltime i_local;
  
  lVar4 = i.tv_sec;
  iVar3 = i.tv_usec;
  i_local._8_8_ = t;
  if (t != (Curl_tree *)0x0) {
    N.smaller = (Curl_tree *)0x0;
    l = (Curl_tree *)0x0;
    y = (Curl_tree *)&l;
    r = (Curl_tree *)&l;
    N.payload = t;
    while( true ) {
      while( true ) {
        if (lVar4 < *(long *)((long)N.payload + 0x20)) {
          local_84 = 0xffffffff;
        }
        else {
          if (*(long *)((long)N.payload + 0x20) < lVar4) {
            local_88 = 1;
          }
          else {
            if (iVar3 < *(int *)((long)N.payload + 0x28)) {
              local_8c = 0xffffffff;
            }
            else {
              local_8c = (uint)(*(int *)((long)N.payload + 0x28) < iVar3);
            }
            local_88 = local_8c;
          }
          local_84 = local_88;
        }
        if (-1 < (int)local_84) break;
        if (*N.payload == 0) goto LAB_0014a3fb;
        if (lVar4 < *(long *)(*N.payload + 0x20)) {
          local_90 = 0xffffffff;
        }
        else {
          if (*(long *)(*N.payload + 0x20) < lVar4) {
            local_94 = 1;
          }
          else {
            if (iVar3 < *(int *)(*N.payload + 0x28)) {
              local_98 = 0xffffffff;
            }
            else {
              local_98 = (uint)(*(int *)(*N.payload + 0x28) < iVar3);
            }
            local_94 = local_98;
          }
          local_90 = local_94;
        }
        if ((int)local_90 < 0) {
          plVar1 = *N.payload;
          *(long *)N.payload = plVar1[1];
          plVar1[1] = (long)N.payload;
          N.payload = plVar1;
          if (*plVar1 == 0) goto LAB_0014a3fb;
        }
        y->smaller = (Curl_tree *)N.payload;
        y = (Curl_tree *)N.payload;
        N.payload = *N.payload;
      }
      if (((int)local_84 < 1) || (*(long *)((long)N.payload + 8) == 0)) break;
      if (lVar4 < *(long *)(*(long *)((long)N.payload + 8) + 0x20)) {
        local_9c = 0xffffffff;
      }
      else {
        if (*(long *)(*(long *)((long)N.payload + 8) + 0x20) < lVar4) {
          local_a0 = 1;
        }
        else {
          if (iVar3 < *(int *)(*(long *)((long)N.payload + 8) + 0x28)) {
            local_a4 = 0xffffffff;
          }
          else {
            local_a4 = (uint)(*(int *)(*(long *)((long)N.payload + 8) + 0x28) < iVar3);
          }
          local_a0 = local_a4;
        }
        local_9c = local_a0;
      }
      if (0 < (int)local_9c) {
        puVar2 = *(undefined8 **)((long)N.payload + 8);
        *(undefined8 *)((long)N.payload + 8) = *puVar2;
        *puVar2 = N.payload;
        N.payload = puVar2;
        if (puVar2[1] == 0) break;
      }
      r->larger = (Curl_tree *)N.payload;
      r = (Curl_tree *)N.payload;
      N.payload = *(void **)((long)N.payload + 8);
    }
LAB_0014a3fb:
    r->larger = *N.payload;
    y->smaller = *(Curl_tree **)((long)N.payload + 8);
    *(Curl_tree **)N.payload = N.smaller;
    *(Curl_tree **)((long)N.payload + 8) = l;
    i_local._8_8_ = N.payload;
  }
  return (Curl_tree *)i_local._8_8_;
}

Assistant:

struct Curl_tree *Curl_splay(struct curltime i,
                             struct Curl_tree *t)
{
  struct Curl_tree N, *l, *r, *y;
  long comp;

  if(t == NULL)
    return t;
  N.smaller = N.larger = NULL;
  l = r = &N;

  for(;;) {
    comp = compare(i, t->key);
    if(comp < 0) {
      if(t->smaller == NULL)
        break;
      if(compare(i, t->smaller->key) < 0) {
        y = t->smaller;                           /* rotate smaller */
        t->smaller = y->larger;
        y->larger = t;
        t = y;
        if(t->smaller == NULL)
          break;
      }
      r->smaller = t;                               /* link smaller */
      r = t;
      t = t->smaller;
    }
    else if(comp > 0) {
      if(t->larger == NULL)
        break;
      if(compare(i, t->larger->key) > 0) {
        y = t->larger;                          /* rotate larger */
        t->larger = y->smaller;
        y->smaller = t;
        t = y;
        if(t->larger == NULL)
          break;
      }
      l->larger = t;                              /* link larger */
      l = t;
      t = t->larger;
    }
    else
      break;
  }

  l->larger = t->smaller;                                /* assemble */
  r->smaller = t->larger;
  t->smaller = N.larger;
  t->larger = N.smaller;

  return t;
}